

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_map_equal_real_literal(void)

{
  size_type sVar1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar2;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_03;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_04;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_05;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_06;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_07;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_08;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_09;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_10;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_d28;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_d10;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_cf8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_ce0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_ca8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_c90;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_c78;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_c60;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_c28;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_c10;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_bf8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_be0;
  undefined1 local_bb5;
  int local_bb4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_bb0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_ba8;
  undefined1 local_b48 [65];
  undefined1 local_b07 [2];
  undefined1 local_b05;
  int local_b04 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_af8;
  undefined1 local_a98 [65];
  undefined1 local_a57 [2];
  undefined1 local_a55;
  int local_a54 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a48;
  undefined1 local_9e8 [65];
  undefined1 local_9a7 [2];
  undefined1 local_9a5;
  int local_9a4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_998;
  undefined1 local_938 [77];
  undefined1 local_8eb [2];
  undefined1 local_8e9;
  basic_variable<std::allocator<char>_> local_8e8;
  undefined1 local_8ab [2];
  undefined1 local_8a9;
  basic_variable<std::allocator<char>_> local_8a8;
  undefined1 local_86b [2];
  undefined1 local_869;
  basic_variable<std::allocator<char>_> local_868;
  undefined1 local_82b [2];
  undefined1 local_829;
  basic_variable<std::allocator<char>_> local_828;
  undefined1 local_7ea [2];
  undefined1 auStack_7e8 [8];
  longdouble big_2;
  longdouble zero_2;
  undefined1 local_7c5;
  int local_7c4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_7c0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_7b8;
  undefined1 local_758 [65];
  undefined1 local_717 [2];
  undefined1 local_715;
  int local_714 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_708;
  undefined1 local_6a8 [65];
  undefined1 local_667 [2];
  undefined1 local_665;
  int local_664 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_658;
  undefined1 local_5f8 [65];
  undefined1 local_5b7 [2];
  undefined1 local_5b5;
  int local_5b4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_5a8;
  undefined1 local_548 [77];
  undefined1 local_4fb [2];
  undefined1 local_4f9;
  basic_variable<std::allocator<char>_> local_4f8;
  undefined1 local_4bb [2];
  undefined1 local_4b9;
  basic_variable<std::allocator<char>_> local_4b8;
  undefined1 local_47b [2];
  undefined1 local_479;
  basic_variable<std::allocator<char>_> local_478;
  undefined1 local_43b [2];
  undefined1 local_439;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_3fa [2];
  double local_3f8;
  double big_1;
  double zero_1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_3e0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_3d8;
  undefined1 local_378 [65];
  undefined1 local_337 [2];
  undefined1 local_335;
  int local_334 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_328;
  undefined1 local_2c8 [65];
  undefined1 local_287 [2];
  undefined1 local_285;
  int local_284 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_278;
  undefined1 local_218 [65];
  undefined1 local_1d7 [2];
  undefined1 local_1d5;
  int local_1d4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  undefined1 local_168 [77];
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  float local_10;
  float local_c;
  float big;
  float zero;
  
  local_c = 0.0;
  local_10 = std::numeric_limits<float>::max();
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_12[0] = trial::dynamic::operator==(&local_48,&local_c);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe49,"void equality_suite::compare_map_equal_real_literal()",local_12,&local_49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_5e[0] = trial::dynamic::operator!=(&local_98,&local_c);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe4a,"void equality_suite::compare_map_equal_real_literal()",local_5e,&local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_9b[0] = trial::dynamic::operator==(&local_d8,&local_10);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe4b,"void equality_suite::compare_map_equal_real_literal()",local_9b,&local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_db[0] = trial::dynamic::operator!=(&local_118,&local_10);
  local_119 = '\x01';
  sVar1 = 0xe4c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe4c,"void equality_suite::compare_map_equal_real_literal()",local_db,&local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  local_1d4._4_8_ = &local_1c8;
  local_1d4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_1d4._4_8_,(char (*) [6])"alpha",local_1d4);
  local_168._0_8_ = &local_1c8;
  local_168._8_8_ = 1;
  init._M_len = sVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),
             (basic_map<std::allocator<char>_> *)local_168._0_8_,init);
  local_11b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),&local_c);
  local_1d5 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe4e,"void equality_suite::compare_map_equal_real_literal()",local_11b,&local_1d5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  ppVar2 = &local_1c8;
  local_be0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_168;
  do {
    local_be0 = local_be0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_be0);
  } while (local_be0 != ppVar2);
  local_284._4_8_ = &local_278;
  local_284[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_284._4_8_,(char (*) [6])"alpha",local_284);
  local_218._0_8_ = &local_278;
  local_218._8_8_ = 1;
  init_00._M_len = (size_type)ppVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),
             (basic_map<std::allocator<char>_> *)local_218._0_8_,init_00);
  local_1d7[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),&local_c);
  local_285 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe4f,"void equality_suite::compare_map_equal_real_literal()",local_1d7,&local_285);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  ppVar2 = &local_278;
  local_bf8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_218;
  do {
    local_bf8 = local_bf8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_bf8);
  } while (local_bf8 != ppVar2);
  local_334._4_8_ = &local_328;
  local_334[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_334._4_8_,(char (*) [6])"alpha",local_334);
  local_2c8._0_8_ = &local_328;
  local_2c8._8_8_ = 1;
  init_01._M_len = (size_type)ppVar2;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_2c8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_2c8._0_8_,init_01);
  local_287[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_2c8 + 0x10),&local_10);
  local_335 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe50,"void equality_suite::compare_map_equal_real_literal()",local_287,&local_335);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2c8 + 0x10));
  ppVar2 = &local_328;
  local_c10 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_2c8;
  do {
    local_c10 = local_c10 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_c10);
  } while (local_c10 != ppVar2);
  local_3e0 = &local_3d8;
  zero_1._4_4_ = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_3e0,(char (*) [6])"alpha",(int *)((long)&zero_1 + 4));
  local_378._0_8_ = &local_3d8;
  local_378._8_8_ = 1;
  init_02._M_len = (size_type)ppVar2;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_378 + 0x10),
             (basic_map<std::allocator<char>_> *)local_378._0_8_,init_02);
  local_337[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_378 + 0x10),&local_10);
  zero_1._3_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe51,"void equality_suite::compare_map_equal_real_literal()",local_337,
             (long)&zero_1 + 3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_378 + 0x10));
  local_c28 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_378;
  do {
    local_c28 = local_c28 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_c28);
  } while (local_c28 != &local_3d8);
  big_1 = 0.0;
  local_3f8 = std::numeric_limits<double>::max();
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_3fa[0] = trial::dynamic::operator==(&local_438,&big_1);
  local_439 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe57,"void equality_suite::compare_map_equal_real_literal()",local_3fa,&local_439);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_438);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_43b[0] = trial::dynamic::operator!=(&local_478,&big_1);
  local_479 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe58,"void equality_suite::compare_map_equal_real_literal()",local_43b,&local_479);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_478);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_47b[0] = trial::dynamic::operator==(&local_4b8,&local_3f8);
  local_4b9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe59,"void equality_suite::compare_map_equal_real_literal()",local_47b,&local_4b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4b8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_4bb[0] = trial::dynamic::operator!=(&local_4f8,&local_3f8);
  local_4f9 = '\x01';
  sVar1 = 0xe5a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe5a,"void equality_suite::compare_map_equal_real_literal()",local_4bb,&local_4f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4f8);
  local_5b4._4_8_ = &local_5a8;
  local_5b4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_5b4._4_8_,(char (*) [6])"alpha",local_5b4);
  local_548._0_8_ = &local_5a8;
  local_548._8_8_ = 1;
  init_03._M_len = sVar1;
  init_03._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_548 + 0x10),
             (basic_map<std::allocator<char>_> *)local_548._0_8_,init_03);
  local_4fb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_548 + 0x10),&big_1);
  local_5b5 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe5c,"void equality_suite::compare_map_equal_real_literal()",local_4fb,&local_5b5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_548 + 0x10));
  ppVar2 = &local_5a8;
  local_c60 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_548;
  do {
    local_c60 = local_c60 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_c60);
  } while (local_c60 != ppVar2);
  local_664._4_8_ = &local_658;
  local_664[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_664._4_8_,(char (*) [6])"alpha",local_664);
  local_5f8._0_8_ = &local_658;
  local_5f8._8_8_ = 1;
  init_04._M_len = (size_type)ppVar2;
  init_04._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_5f8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_5f8._0_8_,init_04);
  local_5b7[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_5f8 + 0x10),&big_1);
  local_665 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe5d,"void equality_suite::compare_map_equal_real_literal()",local_5b7,&local_665);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_5f8 + 0x10));
  ppVar2 = &local_658;
  local_c78 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_5f8;
  do {
    local_c78 = local_c78 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_c78);
  } while (local_c78 != ppVar2);
  local_714._4_8_ = &local_708;
  local_714[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_714._4_8_,(char (*) [6])"alpha",local_714);
  local_6a8._0_8_ = &local_708;
  local_6a8._8_8_ = 1;
  init_05._M_len = (size_type)ppVar2;
  init_05._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_6a8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_6a8._0_8_,init_05);
  local_667[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_6a8 + 0x10),&local_3f8);
  local_715 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe5e,"void equality_suite::compare_map_equal_real_literal()",local_667,&local_715);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6a8 + 0x10));
  ppVar2 = &local_708;
  local_c90 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_6a8;
  do {
    local_c90 = local_c90 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_c90);
  } while (local_c90 != ppVar2);
  local_7c0 = &local_7b8;
  local_7c4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_7c0,(char (*) [6])"alpha",&local_7c4);
  local_758._0_8_ = &local_7b8;
  local_758._8_8_ = 1;
  init_06._M_len = (size_type)ppVar2;
  init_06._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_758 + 0x10),
             (basic_map<std::allocator<char>_> *)local_758._0_8_,init_06);
  local_717[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_758 + 0x10),&local_3f8);
  local_7c5 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe5f,"void equality_suite::compare_map_equal_real_literal()",local_717,&local_7c5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_758 + 0x10));
  local_ca8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_758;
  do {
    local_ca8 = local_ca8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_ca8);
  } while (local_ca8 != &local_7b8);
  unique0x00076c00 = (longdouble)0;
  std::numeric_limits<long_double>::max();
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_7ea[0] = trial::dynamic::operator==(&local_828,(longdouble *)((long)&big_2 + 8));
  local_829 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe65,"void equality_suite::compare_map_equal_real_literal()",local_7ea,&local_829);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_828);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_82b[0] = trial::dynamic::operator!=(&local_868,(longdouble *)((long)&big_2 + 8));
  local_869 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe66,"void equality_suite::compare_map_equal_real_literal()",local_82b,&local_869);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_868);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_86b[0] = trial::dynamic::operator==(&local_8a8,(longdouble *)auStack_7e8);
  local_8a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe67,"void equality_suite::compare_map_equal_real_literal()",local_86b,&local_8a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8a8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_8ab[0] = trial::dynamic::operator!=(&local_8e8,(longdouble *)auStack_7e8);
  local_8e9 = '\x01';
  sVar1 = 0xe68;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe68,"void equality_suite::compare_map_equal_real_literal()",local_8ab,&local_8e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8e8);
  local_9a4._4_8_ = &local_998;
  local_9a4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_9a4._4_8_,(char (*) [6])"alpha",local_9a4);
  local_938._0_8_ = &local_998;
  local_938._8_8_ = 1;
  init_07._M_len = sVar1;
  init_07._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_938 + 0x10),
             (basic_map<std::allocator<char>_> *)local_938._0_8_,init_07);
  local_8eb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_938 + 0x10),
                            (longdouble *)((long)&big_2 + 8));
  local_9a5 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe6a,"void equality_suite::compare_map_equal_real_literal()",local_8eb,&local_9a5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_938 + 0x10));
  ppVar2 = &local_998;
  local_ce0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_938;
  do {
    local_ce0 = local_ce0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_ce0);
  } while (local_ce0 != ppVar2);
  local_a54._4_8_ = &local_a48;
  local_a54[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_a54._4_8_,(char (*) [6])"alpha",local_a54);
  local_9e8._0_8_ = &local_a48;
  local_9e8._8_8_ = 1;
  init_08._M_len = (size_type)ppVar2;
  init_08._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_9e8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_9e8._0_8_,init_08);
  local_9a7[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_9e8 + 0x10),
                            (longdouble *)((long)&big_2 + 8));
  local_a55 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe6b,"void equality_suite::compare_map_equal_real_literal()",local_9a7,&local_a55);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_9e8 + 0x10));
  ppVar2 = &local_a48;
  local_cf8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_9e8;
  do {
    local_cf8 = local_cf8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_cf8);
  } while (local_cf8 != ppVar2);
  local_b04._4_8_ = &local_af8;
  local_b04[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_b04._4_8_,(char (*) [6])"alpha",local_b04);
  local_a98._0_8_ = &local_af8;
  local_a98._8_8_ = 1;
  init_09._M_len = (size_type)ppVar2;
  init_09._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_a98 + 0x10),
             (basic_map<std::allocator<char>_> *)local_a98._0_8_,init_09);
  local_a57[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_a98 + 0x10),
                            (longdouble *)auStack_7e8);
  local_b05 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe6c,"void equality_suite::compare_map_equal_real_literal()",local_a57,&local_b05);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_a98 + 0x10));
  ppVar2 = &local_af8;
  local_d10 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_a98;
  do {
    local_d10 = local_d10 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_d10);
  } while (local_d10 != ppVar2);
  local_bb0 = &local_ba8;
  local_bb4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_bb0,(char (*) [6])"alpha",&local_bb4);
  local_b48._0_8_ = &local_ba8;
  local_b48._8_8_ = 1;
  init_10._M_len = (size_type)ppVar2;
  init_10._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_b48 + 0x10),
             (basic_map<std::allocator<char>_> *)local_b48._0_8_,init_10);
  local_b07[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_b48 + 0x10),
                            (longdouble *)auStack_7e8);
  local_bb5 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe6d,"void equality_suite::compare_map_equal_real_literal()",local_b07,&local_bb5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_b48 + 0x10));
  local_d28 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_b48;
  do {
    local_d28 = local_d28 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_d28);
  } while (local_d28 != &local_ba8);
  return;
}

Assistant:

void compare_map_equal_real_literal()
{
    {
        const auto zero = 0.0f;
        const auto big = std::numeric_limits<float>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != big, true);
    }
    {
        const auto zero = 0.0;
        const auto big = std::numeric_limits<double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != big, true);
    }
    {
        const auto zero = 0.0L;
        const auto big = std::numeric_limits<long double>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != big, true);
    }
}